

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrMultisamplePixelBufferAccess.cpp
# Opt level: O0

MultisampleConstPixelBufferAccess *
rr::getSubregion(MultisampleConstPixelBufferAccess *__return_storage_ptr__,
                MultisampleConstPixelBufferAccess *access,int x,int y,int width,int height)

{
  int z;
  int y_00;
  int width_00;
  ConstPixelBufferAccess *access_00;
  ConstPixelBufferAccess local_50;
  int local_28;
  int local_24;
  int height_local;
  int width_local;
  int y_local;
  int x_local;
  MultisampleConstPixelBufferAccess *access_local;
  
  local_28 = height;
  local_24 = width;
  height_local = y;
  width_local = x;
  _y_local = access;
  access_local = __return_storage_ptr__;
  access_00 = MultisampleConstPixelBufferAccess::raw(access);
  y_00 = width_local;
  z = height_local;
  width_00 = MultisampleConstPixelBufferAccess::getNumSamples(_y_local);
  tcu::getSubregion(&local_50,access_00,0,y_00,z,width_00,local_24,local_28);
  MultisampleConstPixelBufferAccess::fromMultisampleAccess(__return_storage_ptr__,&local_50);
  return __return_storage_ptr__;
}

Assistant:

MultisampleConstPixelBufferAccess getSubregion (const MultisampleConstPixelBufferAccess& access, int x, int y, int width, int height)
{
	return MultisampleConstPixelBufferAccess::fromMultisampleAccess(tcu::getSubregion(access.raw(), 0, x, y, access.getNumSamples(), width, height));
}